

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O1

void __thiscall
TextDisplayer::writeText(TextDisplayer *this,string *text,GLint pixelSize,bool rotateColours)

{
  int iVar1;
  Colour *this_00;
  GLfloat *pGVar2;
  char *pcVar3;
  int colourAlias;
  int iVar4;
  
  if (text->_M_string_length != 0) {
    pcVar3 = (text->_M_dataplus)._M_p;
    colourAlias = 0;
    do {
      if (rotateColours) {
        this_00 = Palette::getColour(this->palette,colourAlias);
        pGVar2 = Colour::getColour3fv(this_00);
        glColor3fv(pGVar2);
        iVar4 = colourAlias + 1;
        iVar1 = Palette::getPrimaryColourCount(this->palette);
        colourAlias = 0;
        if (iVar4 != iVar1) {
          colourAlias = iVar4;
        }
      }
      drawCharacter(this,*pcVar3,pixelSize);
      glTranslatef((float)pixelSize,0,0);
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != (text->_M_dataplus)._M_p + text->_M_string_length);
  }
  return;
}

Assistant:

void TextDisplayer::writeText(const string& text, GLint pixelSize, bool rotateColours) {
    int i = 0;
    for(auto it = text.begin(); it != text.end(); ++it) {
        if (rotateColours) {
            glColor3fv(palette->getColour(i)->getColour3fv());
            if (++i == palette->getPrimaryColourCount()) {
                i = 0;
            }
        }
        drawCharacter(*it, pixelSize);
        glTranslatef(pixelSize, 0.0f, 0.0f);
    }
}